

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.h
# Opt level: O2

void google::protobuf::
     Join<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
               (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> start,
               __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> end,
               char *delim,string *result)

{
  long lVar1;
  AlphaNum local_60;
  
  for (lVar1 = 0; start._M_current + lVar1 != end._M_current; lVar1 = lVar1 + 4) {
    if (lVar1 != 0) {
      std::__cxx11::string::append((char *)result);
    }
    strings::AlphaNum::AlphaNum(&local_60,*(start._M_current + lVar1));
    StrAppend(result,&local_60);
  }
  return;
}

Assistant:

void Join(Iterator start, Iterator end, const char* delim,
          std::string* result) {
  for (Iterator it = start; it != end; ++it) {
    if (it != start) {
      result->append(delim);
    }
    StrAppend(result, *it);
  }
}